

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetFileNamespace_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  bool bVar1;
  FileOptions *pFVar2;
  string *psVar3;
  undefined1 in_R9B;
  string_view sVar4;
  undefined8 local_28;
  undefined8 local_20;
  FileDescriptor *descriptor_local;
  
  pFVar2 = FileDescriptor::options((FileDescriptor *)this);
  bVar1 = FileOptions::has_csharp_namespace(pFVar2);
  if (bVar1) {
    pFVar2 = FileDescriptor::options((FileDescriptor *)this);
    psVar3 = FileOptions::csharp_namespace_abi_cxx11_(pFVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else {
    sVar4 = FileDescriptor::package((FileDescriptor *)this);
    local_28 = (csharp *)sVar4._M_len;
    local_20 = sVar4._M_str;
    sVar4._M_str = (char *)0x1;
    sVar4._M_len = (size_t)local_20;
    UnderscoresToCamelCase_abi_cxx11_(__return_storage_ptr__,local_28,sVar4,true,(bool)in_R9B);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileNamespace(const FileDescriptor* descriptor) {
  if (descriptor->options().has_csharp_namespace()) {
    return descriptor->options().csharp_namespace();
  }
  return UnderscoresToCamelCase(descriptor->package(), true, true);
}